

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu.c
# Opt level: O0

int nsync_mu_trylock(nsync_mu *mu)

{
  uint uVar1;
  bool bVar2;
  bool local_19;
  uint local_14;
  uint32_t old_word;
  int result;
  nsync_mu *mu_local;
  
  LOCK();
  bVar2 = mu->word == 0;
  if (bVar2) {
    mu->word = 1;
  }
  UNLOCK();
  if (bVar2) {
    local_14 = 1;
  }
  else {
    uVar1 = mu->word;
    local_19 = false;
    if ((uVar1 & 0xffffff41) == 0) {
      LOCK();
      local_19 = uVar1 == mu->word;
      if (local_19) {
        mu->word = uVar1 + 1 & 0xffffffdf;
      }
      UNLOCK();
    }
    local_14 = (uint)local_19;
  }
  return local_14;
}

Assistant:

int nsync_mu_trylock (nsync_mu *mu) {
	int result;
	IGNORE_RACES_START ();
	if (ATM_CAS_ACQ (&mu->word, 0, MU_WADD_TO_ACQUIRE)) { /* acquire CAS */
		result = 1;
	} else {
		uint32_t old_word = ATM_LOAD (&mu->word);
		result = ((old_word & MU_WZERO_TO_ACQUIRE) == 0 &&
			  ATM_CAS_ACQ (&mu->word, old_word,
				       (old_word + MU_WADD_TO_ACQUIRE) & ~MU_WCLEAR_ON_ACQUIRE));
	}
	IGNORE_RACES_END ();
	RWLOCK_TRYACQUIRE (result, mu, 1);
	return (result);
}